

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O2

Literal * __thiscall
wasm::Literal::extractLaneUI8x16(Literal *__return_storage_ptr__,Literal *this,uint8_t index)

{
  reference other;
  undefined3 in_register_00000011;
  undefined4 in_register_00000014;
  LaneArray<16> local_1a0;
  
  getLanes<unsigned_char,16>
            (&local_1a0,(wasm *)this,
             (Literal *)CONCAT44(in_register_00000014,CONCAT31(in_register_00000011,index)));
  other = std::array<wasm::Literal,_16UL>::at
                    (&local_1a0,(ulong)CONCAT31(in_register_00000011,index));
  Literal(__return_storage_ptr__,other);
  std::array<wasm::Literal,_16UL>::~array(&local_1a0);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::extractLaneUI8x16(uint8_t index) const {
  return getLanesUI8x16().at(index);
}